

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmsg.c
# Opt level: O1

LispPTR flush_pty(void)

{
  return 0;
}

Assistant:

LispPTR flush_pty(void) {
#ifdef MAIKO_HANDLE_CONSOLE_MESSAGES
  struct stat sbuf;
  char buf[MESSAGE_BUFFER_SIZE]; /* Buffer between pty and log file */
  int size;
  static fd_set rfds;
  int rval;
  struct statvfs vfsbuf;
#ifndef LOGINT
  struct timeval selecttimeout = {0, 0};
#endif

  SETJMP(NIL);
  DBPRINT(("flush_pty() called.\n"));
/* polling pty nd flush os message to log file */
#ifndef LOGINT
  FD_SET(cons_pty, &rfds);
  if (select(32, &rfds, NULL, NULL, &selecttimeout) <= 0) return (NIL);

  if ((cons_pty >= 0) && FD_ISSET(cons_pty, &rfds))
#else /* LOGINT */

  if ((cons_pty >= 0) && ((size = read(cons_pty, buf, MESSAGE_BUFFER_SIZE - 1)) > 0))
#endif
  { /* There are messages to log in the file. */
    DBPRINT(("Log msgs being printed...\n"));
    close(log_id);
    TIMEOUT(log_id = open(logfile, O_WRONLY | O_APPEND, 0666));
    if (log_id == -1) return (NIL);
#ifndef LOGINT
    size = read(cons_pty, buf, MESSAGE_BUFFER_SIZE - 1);
#endif
    if (size == -1) return (NIL);

    /* Check free space to avoid printing System Error Message
       to /dev/console */
    TIMEOUT(rval = statvfs("/tmp", &vfsbuf));
    if (rval != 0) return (NIL);

    if (vfsbuf.f_bavail <= (long)0) {
      /* No Free Space */
      error("osmessage error: No free space on file system (/tmp).");
      return (NIL);
    }
    logChanged = 1; /* Note the change, for READP */
    TIMEOUT(rval = write(log_id, buf, size));
    if (rval == -1) {
      if (errno == ENOSPC) /* == 28 on Sun, ibm */
      {
        /* No free space, but it's too late to avoid
           print system Error Message. */
        error("osmessage error: No free space on file system (/tmp).");
        return (NIL);
      } else {
        error("osmessage error: cannot write to log file (/tmp)");
        return (NIL);
      }
    } else {
      /**
                  close(id);
      **/
      return (ATOM_T);
    }
  }
  return (NIL);
#else
  return (NIL);
#endif /* MAIKO_HANDLE_CONSOLE_MESSAGES */
}